

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObserver.cpp
# Opt level: O3

void __thiscall CEObserver::~CEObserver(CEObserver *this)

{
  ~CEObserver(this);
  operator_delete(this);
  return;
}

Assistant:

CEObserver::~CEObserver(void)
{
    free_members();
}